

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_tests.cpp
# Opt level: O1

void ConcatTestCheckCount(char *name,int num)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  UnitTest *pUVar3;
  TestSuite *val;
  int *in_R9;
  ulong uVar4;
  uint uVar5;
  AssertionResult iutest_ar;
  allocator<char> local_20d;
  int local_20c;
  AssertionResult local_208;
  AssertionHelper local_1e0;
  undefined1 local_1b0 [392];
  
  local_20c = num;
  if (name != (char *)0x0) {
    pUVar3 = iutest::UnitTest::instance();
    uVar5 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                                 super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                                super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar5) {
      uVar4 = 0;
      do {
        pUVar3 = iutest::UnitTest::instance();
        val = (pUVar3->super_UnitTestImpl).m_testsuites.
              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
        iVar2 = strcmp((val->m_testsuite_name)._M_dataplus._M_p,name);
        if (iVar2 == 0) goto LAB_00169a77;
        uVar4 = uVar4 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar4);
    }
  }
  val = (TestSuite *)0x0;
LAB_00169a77:
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>(&local_208,"(p)",val);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_20d);
    local_1e0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/concat_tests.cpp"
    ;
    local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x43;
    local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_1b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p == &local_208.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_208.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_message._M_dataplus._M_p,
                      local_208.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_4_ =
         (undefined4)
         ((ulong)((long)(val->m_testinfos).
                        super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(val->m_testinfos).
                       super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3);
    iutest::internal::CmpHelperEQ<int,int>
              (&local_208,(internal *)"num","p->total_test_count()",(char *)&local_20c,
               (int *)local_1b0,in_R9);
    if (local_208.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_20d);
      local_1e0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/concat_tests.cpp"
      ;
      local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x44;
      local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_1b0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_208.m_message._M_dataplus._M_p,
                  local_208.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void ConcatTestCheckCount(const char* name, int num)
{
    const ::iutest::TestSuite* p = ::iuutil::FindTestSuite(name);
    IUTEST_ASSERT_NOTNULL(p);
    IUTEST_ASSERT_EQ(num, p->total_test_count());
}